

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O0

void __thiscall
Diligent::RefCountersImpl::Attach<Diligent::ResourceMappingImpl,Diligent::FixedBlockMemoryAllocator>
          (RefCountersImpl *this,ResourceMappingImpl *pObject,FixedBlockMemoryAllocator *pAllocator)

{
  ObjectState OVar1;
  Char *Message;
  undefined1 local_40 [8];
  string msg;
  FixedBlockMemoryAllocator *pAllocator_local;
  ResourceMappingImpl *pObject_local;
  RefCountersImpl *this_local;
  
  msg.field_2._8_8_ = pAllocator;
  OVar1 = std::atomic<Diligent::RefCountersImpl::ObjectState>::load
                    (&this->m_ObjectState,memory_order_seq_cst);
  if (OVar1 != NotInitialized) {
    FormatString<char[33]>((string *)local_40,(char (*) [33])"Object has already been attached");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"Attach",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/RefCountedObjectImpl.hpp"
               ,0x10d);
    std::__cxx11::string::~string((string *)local_40);
  }
  ObjectWrapper<Diligent::ResourceMappingImpl,_Diligent::FixedBlockMemoryAllocator>::ObjectWrapper
            ((ObjectWrapper<Diligent::ResourceMappingImpl,_Diligent::FixedBlockMemoryAllocator> *)
             this->m_ObjectWrapperBuffer,pObject,(FixedBlockMemoryAllocator *)msg.field_2._8_8_);
  std::atomic<Diligent::RefCountersImpl::ObjectState>::store
            (&this->m_ObjectState,Alive,memory_order_seq_cst);
  return;
}

Assistant:

void Attach(ObjectType* pObject, AllocatorType* pAllocator)
    {
        VERIFY(m_ObjectState.load() == ObjectState::NotInitialized, "Object has already been attached");
        static_assert(sizeof(ObjectWrapper<ObjectType, AllocatorType>) == sizeof(m_ObjectWrapperBuffer), "Unexpected object wrapper size");
        new (m_ObjectWrapperBuffer) ObjectWrapper<ObjectType, AllocatorType>{pObject, pAllocator};
        m_ObjectState.store(ObjectState::Alive);
    }